

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwSetWindowAspectRatio(GLFWwindow *handle,int numer,int denom)

{
  _GLFWwindow *window;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sidneydijkstra[P]SDEN/external/glfw-3.2.1/src/window.c"
                  ,0x228,"void glfwSetWindowAspectRatio(GLFWwindow *, int, int)");
  }
  if (_glfwInitialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if ((denom != -1 && numer != -1) && (numer < 1 || denom < 1)) {
    _glfwInputError(0x10004,"Invalid window aspect ratio %i:%i");
    return;
  }
  *(int *)(handle + 0x60) = numer;
  *(int *)(handle + 100) = denom;
  if ((*(long *)(handle + 0x40) == 0) && (*(int *)(handle + 8) != 0)) {
    _glfwPlatformSetWindowAspectRatio((_GLFWwindow *)handle,numer,denom);
    return;
  }
  return;
}

Assistant:

GLFWAPI void glfwSetWindowAspectRatio(GLFWwindow* handle, int numer, int denom)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (numer != GLFW_DONT_CARE && denom != GLFW_DONT_CARE)
    {
        if (numer <= 0 || denom <= 0)
        {
            _glfwInputError(GLFW_INVALID_VALUE,
                            "Invalid window aspect ratio %i:%i",
                            numer, denom);
            return;
        }
    }

    window->numer = numer;
    window->denom = denom;

    if (window->monitor || !window->resizable)
        return;

    _glfwPlatformSetWindowAspectRatio(window, numer, denom);
}